

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O1

int mbedtls_pk_parse_subpubkey(uchar **p,uchar *end,mbedtls_pk_context *pk)

{
  int iVar1;
  mbedtls_pk_info_t *info;
  uchar *end_00;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  mbedtls_asn1_buf alg_params;
  mbedtls_pk_type_t local_44;
  size_t local_40;
  mbedtls_asn1_buf local_38;
  
  local_44 = MBEDTLS_PK_NONE;
  iVar1 = mbedtls_asn1_get_tag(p,end,&local_40,0x30);
  if (iVar1 == 0) {
    end_00 = *p + local_40;
    iVar1 = pk_get_pk_alg(p,end_00,&local_44,&local_38);
    if (iVar1 == 0) {
      iVar1 = mbedtls_asn1_get_bitstring_null(p,end_00,&local_40);
      if (iVar1 == 0) {
        iVar1 = -0x3b66;
        if (*p + local_40 == end_00) {
          info = mbedtls_pk_info_from_type(local_44);
          if (info == (mbedtls_pk_info_t *)0x0) {
            iVar1 = -0x3c80;
          }
          else {
            iVar1 = mbedtls_pk_setup(pk,info);
            if (iVar1 == 0) {
              if (local_44 == MBEDTLS_PK_RSA) {
                iVar1 = pk_get_rsapubkey(p,end_00,(mbedtls_rsa_context *)pk->pk_ctx);
              }
              else {
                iVar1 = -0x3c80;
                if (((local_44 & ~MBEDTLS_PK_RSA) == MBEDTLS_PK_ECKEY) &&
                   (iVar1 = pk_use_ecparams(&local_38,(mbedtls_ecp_group *)pk->pk_ctx), iVar1 == 0))
                {
                  iVar1 = pk_get_ecpubkey(p,end_00,(mbedtls_ecp_keypair *)pk->pk_ctx);
                }
              }
              if (iVar1 == 0) {
                iVar1 = -0x3b66;
                if (*p == end_00) {
                  iVar1 = 0;
                }
              }
              if (iVar1 != 0) {
                mbedtls_pk_free(pk);
              }
            }
          }
        }
      }
      else {
        iVar1 = iVar1 + -0x3b00;
      }
    }
  }
  else {
    iVar1 = iVar1 + -0x3d00;
  }
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_subpubkey( unsigned char **p, const unsigned char *end,
                        mbedtls_pk_context *pk )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;
    mbedtls_asn1_buf alg_params;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    const mbedtls_pk_info_t *pk_info;

    PK_VALIDATE_RET( p != NULL );
    PK_VALIDATE_RET( *p != NULL );
    PK_VALIDATE_RET( end != NULL );
    PK_VALIDATE_RET( pk != NULL );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = *p + len;

    if( ( ret = pk_get_pk_alg( p, end, &pk_alg, &alg_params ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_asn1_get_bitstring_null( p, end, &len ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    if( ( pk_info = mbedtls_pk_info_from_type( pk_alg ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA )
    {
        ret = pk_get_rsapubkey( p, end, mbedtls_pk_rsa( *pk ) );
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECKEY_DH || pk_alg == MBEDTLS_PK_ECKEY )
    {
        ret = pk_use_ecparams( &alg_params, &mbedtls_pk_ec( *pk )->grp );
        if( ret == 0 )
            ret = pk_get_ecpubkey( p, end, mbedtls_pk_ec( *pk ) );
    } else
#endif /* MBEDTLS_ECP_C */
        ret = MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    if( ret == 0 && *p != end )
        ret = MBEDTLS_ERR_PK_INVALID_PUBKEY
              MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;

    if( ret != 0 )
        mbedtls_pk_free( pk );

    return( ret );
}